

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Acb_NtkFindNamesInPlaces(char *pBuffer,Vec_Int_t *vPlaces,Vec_Ptr_t *vPivots)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Vec_Ptr_t *vNames;
  char *__needle;
  char *pcVar5;
  char *pcVar6;
  char *__s1;
  void **__ptr;
  long lVar7;
  uint i;
  int i_00;
  uint uVar8;
  char pLocal [1000];
  
  piVar4 = Abc_FrameReadGateCounts();
  vNames = Vec_PtrAlloc(100);
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    piVar4[lVar7] = 0;
  }
  i = 0;
  do {
    if (vPlaces->nSize <= (int)(i | 1)) {
      Abc_FrameSetSignalNames(vNames);
      return;
    }
    iVar1 = Vec_IntEntry(vPlaces,i);
    iVar2 = Vec_IntEntry(vPlaces,i | 1);
    __needle = (char *)Vec_PtrEntry(vPivots,iVar2);
    lVar7 = 0;
    while( true ) {
      if (lVar7 == 1000) {
        __assert_fail("k < 1000",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                      ,0x3c6,"void Acb_NtkFindNamesInPlaces(char *, Vec_Int_t *, Vec_Ptr_t *)");
      }
      if (pBuffer[lVar7 + iVar1] == '\n') break;
      pLocal[lVar7] = pBuffer[lVar7 + iVar1];
      lVar7 = lVar7 + 1;
    }
    pLocal[lVar7] = '\0';
    pcVar5 = strstr(pLocal,__needle);
    if (pcVar5 == (char *)0x0) {
      printf("Cannot find location of signal \"%s\" in this line.\n",__needle);
    }
    else {
      pcVar6 = strtok(pLocal," \r\n\t,;()");
      iVar1 = 0;
      while (pcVar6 != (char *)0x0) {
        iVar2 = strcmp(pcVar6,"1\'b0");
        if (iVar2 == 0) {
          *piVar4 = *piVar4 + 1;
        }
        else {
          iVar2 = strcmp(pcVar6,"1\'b1");
          if (iVar2 == 0) {
            piVar4[1] = piVar4[1] + 1;
          }
          else {
            iVar2 = strcmp(pcVar6,"buf");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar6,"assign"), iVar2 == 0)) {
              piVar4[2] = piVar4[2] + 1;
            }
            else {
              iVar2 = strcmp(pcVar6,"not");
              if (iVar2 == 0) {
                piVar4[3] = piVar4[3] + 1;
              }
              else {
                iVar2 = strcmp(pcVar6,__needle);
                if ((pcVar5 < pcVar6) && (iVar2 != 0)) {
                  iVar1 = iVar1 + 1;
                  iVar2 = vNames->nSize;
                  for (i_00 = 0; i_00 < iVar2; i_00 = i_00 + 1) {
                    __s1 = (char *)Vec_PtrEntry(vNames,i_00);
                    iVar3 = strcmp(__s1,pcVar6);
                    if (iVar3 == 0) break;
                  }
                  if (iVar2 == i_00) {
                    pcVar6 = Abc_UtilStrsav(pcVar6);
                    if (iVar2 == vNames->nCap) {
                      uVar8 = iVar2 * 2;
                      if (iVar2 < 0x10) {
                        uVar8 = 0x10;
                      }
                      __ptr = vNames->pArray;
                      if (iVar2 < (int)uVar8) {
                        if (__ptr == (void **)0x0) {
                          __ptr = (void **)malloc((ulong)uVar8 << 3);
                        }
                        else {
                          __ptr = (void **)realloc(__ptr,(ulong)uVar8 << 3);
                        }
                        vNames->pArray = __ptr;
                        vNames->nCap = uVar8;
                      }
                    }
                    else {
                      __ptr = vNames->pArray;
                    }
                    vNames->nSize = iVar2 + 1;
                    __ptr[iVar2] = pcVar6;
                  }
                }
              }
            }
          }
        }
        pcVar6 = strtok((char *)0x0," \r\n\t,;()");
      }
      if (1 < iVar1) {
        piVar4[4] = piVar4[4] + iVar1 + -1;
      }
    }
    i = i + 2;
  } while( true );
}

Assistant:

void Acb_NtkFindNamesInPlaces( char * pBuffer, Vec_Int_t * vPlaces, Vec_Ptr_t * vPivots )
{
    int * pCounts = Abc_FrameReadGateCounts();
    Vec_Ptr_t * vNames = Vec_PtrAlloc( 100 );
    int i, k, iObj, Pos;
    for ( i = 0; i < 5; i++ )
        pCounts[i] = 0;
    Vec_IntForEachEntryDouble( vPlaces, Pos, iObj, i )
    {
        int nFanins = 0;
        char pLocal[1000], * pTemp, * pName, * pSpot;
        char * pPivot = (char *)Vec_PtrEntry(vPivots, iObj);
        for ( k = 0; k < 1000; k++ )
        {
            if ( pBuffer[Pos+k] == '\n' )
            {
                pLocal[k] = 0;
                break;
            }
            else
                pLocal[k] = pBuffer[Pos+k];
        }
        assert( k < 1000 );
        pSpot = strstr( pLocal, pPivot );
        if ( pSpot == NULL )
        {
            printf( "Cannot find location of signal \"%s\" in this line.\n", pPivot );
            continue;
        }
        pTemp = strtok( pLocal, " \r\n\t,;()" );
        while ( pTemp )
        {
            if ( !strcmp(pTemp, "1\'b0") )
                pCounts[0]++;
            else if ( !strcmp(pTemp, "1\'b1") )
                pCounts[1]++;
            else if ( !strcmp(pTemp, "buf") || !strcmp(pTemp, "assign") )
                pCounts[2]++;
            else if ( !strcmp(pTemp, "not") )
                pCounts[3]++;
            else if ( strcmp(pTemp, pPivot) && pTemp > pSpot )
            {
                nFanins++;
                Vec_PtrForEachEntry( char *, vNames, pName, k )
                    if ( !strcmp(pName, pTemp) )
                        break;
                if ( k == Vec_PtrSize(vNames) )
                    Vec_PtrPush( vNames, Abc_UtilStrsav(pTemp) );
            }
            pTemp = strtok( NULL, " \r\n\t,;()" );
        }
        if ( nFanins > 1 )
            pCounts[4] += nFanins-1;
    }
    //printf( "Found %d names\n", Vec_PtrSize(vNames) );
    Abc_FrameSetSignalNames( vNames );
}